

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cpp
# Opt level: O0

Sequence * __thiscall Sequence::operator=(Sequence *this,uint64_t seq)

{
  int iVar1;
  uint *puVar2;
  int local_20;
  int i;
  int n;
  uint64_t seq_local;
  Sequence *this_local;
  
  iVar1 = size(this);
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    puVar2 = (uint *)std::deque<int,_std::allocator<int>_>::operator[](&this->m_bits,(long)local_20)
    ;
    *puVar2 = (uint)(seq >> ((byte)local_20 & 0x3f)) & 1;
  }
  return this;
}

Assistant:

Sequence &Sequence::operator=(uint64_t seq) {
    auto n = size();
    for (auto i = 0; i < n; ++i) {
        m_bits[i] = (seq >> i) & 1;
    }
    return *this;
}